

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall PathParser::parse(PathParser *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  float extraout_var_07;
  float extraout_var_08;
  float extraout_var_09;
  float extraout_var_10;
  float extraout_var_11;
  float extraout_var_12;
  float extraout_var_13;
  float extraout_var_14;
  float extraout_var_15;
  float extraout_var_16;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  EVP_PKEY_CTX *extraout_RDX_10;
  EVP_PKEY_CTX *extraout_RDX_11;
  EVP_PKEY_CTX *extraout_RDX_12;
  EVP_PKEY_CTX *extraout_RDX_13;
  EVP_PKEY_CTX *extraout_RDX_14;
  EVP_PKEY_CTX *extraout_RDX_15;
  EVP_PKEY_CTX *extraout_RDX_16;
  EVP_PKEY_CTX *extraout_RDX_17;
  EVP_PKEY_CTX *extraout_RDX_18;
  EVP_PKEY_CTX *extraout_RDX_19;
  EVP_PKEY_CTX *extraout_RDX_20;
  EVP_PKEY_CTX *extraout_RDX_21;
  EVP_PKEY_CTX *extraout_RDX_22;
  EVP_PKEY_CTX *extraout_RDX_23;
  EVP_PKEY_CTX *extraout_RDX_24;
  EVP_PKEY_CTX *extraout_RDX_25;
  EVP_PKEY_CTX *extraout_RDX_26;
  EVP_PKEY_CTX *extraout_RDX_27;
  EVP_PKEY_CTX *extraout_RDX_28;
  EVP_PKEY_CTX *extraout_RDX_29;
  EVP_PKEY_CTX *extraout_RDX_30;
  EVP_PKEY_CTX *extraout_RDX_31;
  EVP_PKEY_CTX *extraout_RDX_32;
  EVP_PKEY_CTX *extraout_RDX_33;
  EVP_PKEY_CTX *pEVar4;
  EVP_PKEY_CTX *extraout_RDX_34;
  code *p1_00;
  Point *pPVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Point r_00;
  allocator<char> local_309;
  string local_308;
  Point local_2e8;
  Point local_2e0;
  Point local_2d8;
  byte local_2ce;
  byte local_2cd;
  float local_2cc;
  bool sweep_1;
  bool large_arc_1;
  Point PStack_2c8;
  float rotation_1;
  Point r_1;
  bool sweep;
  bool large_arc;
  float rotation;
  Point r;
  Point local_280;
  Point local_278;
  Point local_270;
  Point local_268;
  Point p1_7;
  Point local_248;
  Point local_240;
  Point p1_6;
  Point local_228;
  Point local_220;
  Point local_218;
  Point local_210;
  Point p1_5;
  Point local_1f0;
  Point p1_4;
  Point local_1d8;
  Point local_1d0;
  Point local_1c8;
  Point local_1c0;
  Point p2_3;
  Point local_1b0;
  Point p1_3;
  Point local_190;
  Point p2_2;
  Point local_180;
  Point p1_2;
  Point local_168;
  Point local_160;
  Point local_158;
  Point local_150;
  Point p2_1;
  Point local_140;
  Point p1_1;
  Point local_120;
  Point p2;
  Point p1;
  Parser local_100;
  Parser local_f0;
  Parser local_e0;
  Parser local_d0;
  Point local_c0;
  Point local_b8;
  Parser local_b0;
  Point local_a0;
  Parser local_98;
  Point local_88;
  Point local_80;
  Parser local_78;
  Point local_68;
  Point local_60;
  Point local_58;
  Parser local_50;
  Point local_3c;
  Character local_31;
  Point PStack_30;
  Character command;
  Point quadratic_p1;
  Point cubic_p2;
  Point initial_point;
  Point current_point;
  PathParser *this_local;
  
  Point::Point(&initial_point,0.0,0.0);
  Point::Point(&cubic_p2,0.0,0.0);
  Point::Point(&quadratic_p1,0.0,0.0);
  Point::Point(&stack0xffffffffffffffd0,0.0,0.0);
  Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  do {
    bVar1 = Parser::has_next(&this->super_Parser);
    if (!bVar1) {
      return;
    }
    local_31 = Parser::next(&this->super_Parser);
    p1_00 = Parser::white_space;
    Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
    cVar2 = Character::operator_cast_to_char(&local_31);
    if (cVar2 == 'M') {
      local_3c = parse_point(this);
      pPVar5 = &initial_point;
      initial_point = local_3c;
      Path::move_to(this->path,pPVar5);
      cubic_p2 = initial_point;
      pEVar4 = extraout_RDX;
      while( true ) {
        iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)pPVar5,pEVar4);
        local_50.s.s = (char *)CONCAT44(extraout_var,iVar3);
        bVar1 = Parser::parse<bool(&)(Character)>(&local_50,Parser::number_start_char);
        if (!bVar1) break;
        local_58 = parse_point(this);
        pPVar5 = &initial_point;
        initial_point = local_58;
        Path::line_to(this->path,pPVar5);
        pEVar4 = extraout_RDX_00;
      }
    }
    else {
      cVar2 = Character::operator_cast_to_char(&local_31);
      if (cVar2 == 'm') {
        local_68 = parse_point(this);
        local_60 = Point::operator+(&initial_point,&local_68);
        pPVar5 = &initial_point;
        initial_point = local_60;
        Path::move_to(this->path,pPVar5);
        cubic_p2 = initial_point;
        pEVar4 = extraout_RDX_01;
        while( true ) {
          iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)pPVar5,pEVar4);
          local_78.s.s = (char *)CONCAT44(extraout_var_00,iVar3);
          bVar1 = Parser::parse<bool(&)(Character)>(&local_78,Parser::number_start_char);
          if (!bVar1) break;
          local_88 = parse_point(this);
          local_80 = Point::operator+(&initial_point,&local_88);
          pPVar5 = &initial_point;
          initial_point = local_80;
          Path::line_to(this->path,pPVar5);
          pEVar4 = extraout_RDX_02;
        }
      }
      else {
        cVar2 = Character::operator_cast_to_char(&local_31);
        pEVar4 = extraout_RDX_03;
        if (cVar2 == 'L') {
          while( true ) {
            iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
            local_98.s.s = (char *)CONCAT44(extraout_var_01,iVar3);
            bVar1 = Parser::parse<bool(&)(Character)>(&local_98,Parser::number_start_char);
            if (!bVar1) break;
            local_a0 = parse_point(this);
            p1_00 = (code *)&initial_point;
            initial_point = local_a0;
            Path::line_to(this->path,(Point *)p1_00);
            pEVar4 = extraout_RDX_04;
          }
        }
        else {
          cVar2 = Character::operator_cast_to_char(&local_31);
          pEVar4 = extraout_RDX_05;
          if (cVar2 == 'l') {
            while( true ) {
              iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
              local_b0.s.s = (char *)CONCAT44(extraout_var_02,iVar3);
              bVar1 = Parser::parse<bool(&)(Character)>(&local_b0,Parser::number_start_char);
              if (!bVar1) break;
              local_c0 = parse_point(this);
              local_b8 = Point::operator+(&initial_point,&local_c0);
              p1_00 = (code *)&initial_point;
              initial_point = local_b8;
              Path::line_to(this->path,(Point *)p1_00);
              pEVar4 = extraout_RDX_06;
            }
          }
          else {
            cVar2 = Character::operator_cast_to_char(&local_31);
            pEVar4 = extraout_RDX_07;
            if (cVar2 == 'H') {
              while( true ) {
                iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
                local_d0.s.s = (char *)CONCAT44(extraout_var_03,iVar3);
                bVar1 = Parser::parse<bool(&)(Character)>(&local_d0,Parser::number_start_char);
                if (!bVar1) break;
                fVar6 = Parser::parse_number(&this->super_Parser);
                initial_point.x = fVar6;
                Parser::parse_all<bool(&)(Character)>
                          (&this->super_Parser,Parser::white_space_or_comma);
                p1_00 = (code *)&initial_point;
                Path::line_to(this->path,(Point *)p1_00);
                pEVar4 = extraout_RDX_08;
              }
            }
            else {
              cVar2 = Character::operator_cast_to_char(&local_31);
              pEVar4 = extraout_RDX_09;
              if (cVar2 == 'h') {
                while( true ) {
                  iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
                  local_e0.s.s = (char *)CONCAT44(extraout_var_04,iVar3);
                  bVar1 = Parser::parse<bool(&)(Character)>(&local_e0,Parser::number_start_char);
                  if (!bVar1) break;
                  fVar6 = Parser::parse_number(&this->super_Parser);
                  initial_point.x = fVar6 + initial_point.x;
                  Parser::parse_all<bool(&)(Character)>
                            (&this->super_Parser,Parser::white_space_or_comma);
                  p1_00 = (code *)&initial_point;
                  Path::line_to(this->path,(Point *)p1_00);
                  pEVar4 = extraout_RDX_10;
                }
              }
              else {
                cVar2 = Character::operator_cast_to_char(&local_31);
                pEVar4 = extraout_RDX_11;
                if (cVar2 == 'V') {
                  while( true ) {
                    iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
                    local_f0.s.s = (char *)CONCAT44(extraout_var_05,iVar3);
                    bVar1 = Parser::parse<bool(&)(Character)>(&local_f0,Parser::number_start_char);
                    if (!bVar1) break;
                    fVar6 = Parser::parse_number(&this->super_Parser);
                    initial_point.y = fVar6;
                    Parser::parse_all<bool(&)(Character)>
                              (&this->super_Parser,Parser::white_space_or_comma);
                    p1_00 = (code *)&initial_point;
                    Path::line_to(this->path,(Point *)p1_00);
                    pEVar4 = extraout_RDX_12;
                  }
                }
                else {
                  cVar2 = Character::operator_cast_to_char(&local_31);
                  pEVar4 = extraout_RDX_13;
                  if (cVar2 == 'v') {
                    while( true ) {
                      iVar3 = Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4);
                      local_100.s.s = (char *)CONCAT44(extraout_var_06,iVar3);
                      bVar1 = Parser::parse<bool(&)(Character)>
                                        (&local_100,Parser::number_start_char);
                      if (!bVar1) break;
                      fVar6 = Parser::parse_number(&this->super_Parser);
                      initial_point.y = fVar6 + initial_point.y;
                      Parser::parse_all<bool(&)(Character)>
                                (&this->super_Parser,Parser::white_space_or_comma);
                      p1_00 = (code *)&initial_point;
                      Path::line_to(this->path,(Point *)p1_00);
                      pEVar4 = extraout_RDX_14;
                    }
                  }
                  else {
                    cVar2 = Character::operator_cast_to_char(&local_31);
                    pEVar4 = extraout_RDX_15;
                    if (cVar2 == 'C') {
                      while( true ) {
                        p1.x = (float)Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,pEVar4)
                        ;
                        p1.y = extraout_var_07;
                        bVar1 = Parser::parse<bool(&)(Character)>
                                          ((Parser *)&p1,Parser::number_start_char);
                        if (!bVar1) break;
                        p2 = parse_point(this);
                        local_120 = parse_point(this);
                        initial_point = parse_point(this);
                        p1_00 = (code *)&p2;
                        Path::curve_to(this->path,(Point *)p1_00,&local_120,&initial_point);
                        quadratic_p1 = local_120;
                        pEVar4 = extraout_RDX_16;
                      }
                    }
                    else {
                      cVar2 = Character::operator_cast_to_char(&local_31);
                      pEVar4 = extraout_RDX_17;
                      if (cVar2 == 'c') {
                        while( true ) {
                          p1_1.x = (float)Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,
                                                       pEVar4);
                          p1_1.y = extraout_var_08;
                          bVar1 = Parser::parse<bool(&)(Character)>
                                            ((Parser *)&p1_1,Parser::number_start_char);
                          if (!bVar1) break;
                          p2_1 = parse_point(this);
                          local_140 = Point::operator+(&initial_point,&p2_1);
                          local_158 = parse_point(this);
                          local_150 = Point::operator+(&initial_point,&local_158);
                          local_168 = parse_point(this);
                          local_160 = Point::operator+(&initial_point,&local_168);
                          p1_00 = (code *)&local_140;
                          initial_point = local_160;
                          Path::curve_to(this->path,(Point *)p1_00,&local_150,&initial_point);
                          quadratic_p1 = local_150;
                          pEVar4 = extraout_RDX_18;
                        }
                      }
                      else {
                        cVar2 = Character::operator_cast_to_char(&local_31);
                        pEVar4 = extraout_RDX_19;
                        if (cVar2 == 'S') {
                          while( true ) {
                            p1_2.x = (float)Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00,
                                                         pEVar4);
                            p1_2.y = extraout_var_09;
                            bVar1 = Parser::parse<bool(&)(Character)>
                                              ((Parser *)&p1_2,Parser::number_start_char);
                            if (!bVar1) break;
                            p2_2 = Point::operator*(&initial_point,2.0);
                            local_180 = Point::operator-(&p2_2,&quadratic_p1);
                            local_190 = parse_point(this);
                            initial_point = parse_point(this);
                            p1_00 = (code *)&local_180;
                            Path::curve_to(this->path,(Point *)p1_00,&local_190,&initial_point);
                            quadratic_p1 = local_190;
                            pEVar4 = extraout_RDX_20;
                          }
                        }
                        else {
                          cVar2 = Character::operator_cast_to_char(&local_31);
                          pEVar4 = extraout_RDX_21;
                          if (cVar2 == 's') {
                            while( true ) {
                              p1_3.x = (float)Parser::copy(&this->super_Parser,(EVP_PKEY_CTX *)p1_00
                                                           ,pEVar4);
                              p1_3.y = extraout_var_10;
                              bVar1 = Parser::parse<bool(&)(Character)>
                                                ((Parser *)&p1_3,Parser::number_start_char);
                              if (!bVar1) break;
                              p2_3 = Point::operator*(&initial_point,2.0);
                              local_1b0 = Point::operator-(&p2_3,&quadratic_p1);
                              local_1c8 = parse_point(this);
                              local_1c0 = Point::operator+(&initial_point,&local_1c8);
                              local_1d8 = parse_point(this);
                              local_1d0 = Point::operator+(&initial_point,&local_1d8);
                              p1_00 = (code *)&local_1b0;
                              initial_point = local_1d0;
                              Path::curve_to(this->path,(Point *)p1_00,&local_1c0,&initial_point);
                              quadratic_p1 = local_1c0;
                              pEVar4 = extraout_RDX_22;
                            }
                          }
                          else {
                            cVar2 = Character::operator_cast_to_char(&local_31);
                            pEVar4 = extraout_RDX_23;
                            if (cVar2 == 'Q') {
                              while( true ) {
                                p1_4.x = (float)Parser::copy(&this->super_Parser,
                                                             (EVP_PKEY_CTX *)p1_00,pEVar4);
                                p1_4.y = extraout_var_11;
                                bVar1 = Parser::parse<bool(&)(Character)>
                                                  ((Parser *)&p1_4,Parser::number_start_char);
                                if (!bVar1) break;
                                local_1f0 = parse_point(this);
                                initial_point = parse_point(this);
                                p1_00 = (code *)&local_1f0;
                                Path::quadratic_curve_to(this->path,(Point *)p1_00,&initial_point);
                                PStack_30 = local_1f0;
                                pEVar4 = extraout_RDX_24;
                              }
                            }
                            else {
                              cVar2 = Character::operator_cast_to_char(&local_31);
                              pEVar4 = extraout_RDX_25;
                              if (cVar2 == 'q') {
                                while( true ) {
                                  p1_5.x = (float)Parser::copy(&this->super_Parser,
                                                               (EVP_PKEY_CTX *)p1_00,pEVar4);
                                  p1_5.y = extraout_var_12;
                                  bVar1 = Parser::parse<bool(&)(Character)>
                                                    ((Parser *)&p1_5,Parser::number_start_char);
                                  if (!bVar1) break;
                                  local_218 = parse_point(this);
                                  local_210 = Point::operator+(&initial_point,&local_218);
                                  local_228 = parse_point(this);
                                  local_220 = Point::operator+(&initial_point,&local_228);
                                  p1_00 = (code *)&local_210;
                                  initial_point = local_220;
                                  Path::quadratic_curve_to(this->path,(Point *)p1_00,&initial_point)
                                  ;
                                  PStack_30 = local_210;
                                  pEVar4 = extraout_RDX_26;
                                }
                              }
                              else {
                                cVar2 = Character::operator_cast_to_char(&local_31);
                                pEVar4 = extraout_RDX_27;
                                if (cVar2 == 'T') {
                                  while( true ) {
                                    p1_6.x = (float)Parser::copy(&this->super_Parser,
                                                                 (EVP_PKEY_CTX *)p1_00,pEVar4);
                                    p1_6.y = extraout_var_13;
                                    bVar1 = Parser::parse<bool(&)(Character)>
                                                      ((Parser *)&p1_6,Parser::number_start_char);
                                    if (!bVar1) break;
                                    local_248 = Point::operator*(&initial_point,2.0);
                                    local_240 = Point::operator-(&local_248,&stack0xffffffffffffffd0
                                                                );
                                    initial_point = parse_point(this);
                                    p1_00 = (code *)&local_240;
                                    Path::quadratic_curve_to
                                              (this->path,(Point *)p1_00,&initial_point);
                                    PStack_30 = local_240;
                                    pEVar4 = extraout_RDX_28;
                                  }
                                }
                                else {
                                  cVar2 = Character::operator_cast_to_char(&local_31);
                                  pEVar4 = extraout_RDX_29;
                                  if (cVar2 == 't') {
                                    while( true ) {
                                      p1_7.x = (float)Parser::copy(&this->super_Parser,
                                                                   (EVP_PKEY_CTX *)p1_00,pEVar4);
                                      p1_7.y = extraout_var_14;
                                      bVar1 = Parser::parse<bool(&)(Character)>
                                                        ((Parser *)&p1_7,Parser::number_start_char);
                                      if (!bVar1) break;
                                      local_270 = Point::operator*(&initial_point,2.0);
                                      local_268 = Point::operator-(&local_270,
                                                                   &stack0xffffffffffffffd0);
                                      local_280 = parse_point(this);
                                      local_278 = Point::operator+(&initial_point,&local_280);
                                      p1_00 = (code *)&local_268;
                                      initial_point = local_278;
                                      Path::quadratic_curve_to
                                                (this->path,(Point *)p1_00,&initial_point);
                                      PStack_30 = local_268;
                                      pEVar4 = extraout_RDX_30;
                                    }
                                  }
                                  else {
                                    cVar2 = Character::operator_cast_to_char(&local_31);
                                    pEVar4 = extraout_RDX_31;
                                    if (cVar2 == 'A') {
                                      while( true ) {
                                        r.x = (float)Parser::copy(&this->super_Parser,
                                                                  (EVP_PKEY_CTX *)p1_00,pEVar4);
                                        r.y = extraout_var_15;
                                        bVar1 = Parser::parse<bool(&)(Character)>
                                                          ((Parser *)&r,Parser::number_start_char);
                                        if (!bVar1) break;
                                        r_00 = parse_point(this);
                                        fVar6 = Parser::parse_number(&this->super_Parser);
                                        Parser::parse_all<bool(&)(Character)>
                                                  (&this->super_Parser,Parser::white_space_or_comma)
                                        ;
                                        fVar7 = Parser::parse_number(&this->super_Parser);
                                        Parser::parse_all<bool(&)(Character)>
                                                  (&this->super_Parser,Parser::white_space_or_comma)
                                        ;
                                        fVar8 = Parser::parse_number(&this->super_Parser);
                                        Parser::parse_all<bool(&)(Character)>
                                                  (&this->super_Parser,Parser::white_space_or_comma)
                                        ;
                                        initial_point = parse_point(this);
                                        p1_00 = (code *)(ulong)(fVar7 != 0.0);
                                        Path::arc_to(this->path,r_00,fVar6,fVar7 != 0.0,fVar8 != 0.0
                                                     ,&initial_point);
                                        pEVar4 = extraout_RDX_32;
                                      }
                                    }
                                    else {
                                      cVar2 = Character::operator_cast_to_char(&local_31);
                                      pEVar4 = extraout_RDX_33;
                                      if (cVar2 == 'a') {
                                        while( true ) {
                                          r_1.x = (float)Parser::copy(&this->super_Parser,
                                                                      (EVP_PKEY_CTX *)p1_00,pEVar4);
                                          r_1.y = extraout_var_16;
                                          bVar1 = Parser::parse<bool(&)(Character)>
                                                            ((Parser *)&r_1,
                                                             Parser::number_start_char);
                                          if (!bVar1) break;
                                          PStack_2c8 = parse_point(this);
                                          local_2cc = Parser::parse_number(&this->super_Parser);
                                          Parser::parse_all<bool(&)(Character)>
                                                    (&this->super_Parser,
                                                     Parser::white_space_or_comma);
                                          fVar6 = Parser::parse_number(&this->super_Parser);
                                          local_2cd = fVar6 != 0.0;
                                          Parser::parse_all<bool(&)(Character)>
                                                    (&this->super_Parser,
                                                     Parser::white_space_or_comma);
                                          fVar6 = Parser::parse_number(&this->super_Parser);
                                          local_2ce = fVar6 != 0.0;
                                          Parser::parse_all<bool(&)(Character)>
                                                    (&this->super_Parser,
                                                     Parser::white_space_or_comma);
                                          local_2e0 = parse_point(this);
                                          local_2d8 = Point::operator+(&initial_point,&local_2e0);
                                          local_2e8 = PStack_2c8;
                                          p1_00 = (code *)(ulong)(local_2cd & 1);
                                          initial_point = local_2d8;
                                          Path::arc_to(this->path,PStack_2c8,local_2cc,
                                                       SUB41(local_2cd & 1,0),(bool)(local_2ce & 1),
                                                       &initial_point);
                                          pEVar4 = extraout_RDX_34;
                                        }
                                      }
                                      else {
                                        cVar2 = Character::operator_cast_to_char(&local_31);
                                        iVar3 = (int)p1_00;
                                        if ((cVar2 != 'Z') &&
                                           (cVar2 = Character::operator_cast_to_char(&local_31),
                                           cVar2 != 'z')) {
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_308,"unexpected command",
                                                     &local_309);
                                          Parser::error(&this->super_Parser,&local_308);
                                        }
                                        Path::close(this->path,iVar3);
                                        initial_point = cubic_p2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    cVar2 = Character::operator_cast_to_char(&local_31);
    if ((((cVar2 != 'C') && (cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 'c')) &&
        (cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 'S')) &&
       (cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 's')) {
      quadratic_p1 = initial_point;
    }
    cVar2 = Character::operator_cast_to_char(&local_31);
    if (((cVar2 != 'Q') && (cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 'q')) &&
       ((cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 'T' &&
        (cVar2 = Character::operator_cast_to_char(&local_31), cVar2 != 't')))) {
      PStack_30 = initial_point;
    }
  } while( true );
}

Assistant:

void parse() {
		Point current_point(0.f, 0.f);
		Point initial_point(0.f, 0.f);
		Point cubic_p2(0.f, 0.f);
		Point quadratic_p1(0.f, 0.f);
		parse_all(white_space);
		while (has_next()) {
			const Character command = next();
			parse_all(white_space);
			if (command == 'M') {
				current_point = parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'm') {
				current_point = current_point + parse_point();
				path.move_to(current_point);
				initial_point = current_point;
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'L') {
				while (copy().parse(number_start_char)) {
					current_point = parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'l') {
				while (copy().parse(number_start_char)) {
					current_point = current_point + parse_point();
					path.line_to(current_point);
				}
			}
			else if (command == 'H') {
				while (copy().parse(number_start_char)) {
					current_point.x = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'h') {
				while (copy().parse(number_start_char)) {
					current_point.x += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'V') {
				while (copy().parse(number_start_char)) {
					current_point.y = parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'v') {
				while (copy().parse(number_start_char)) {
					current_point.y += parse_number();
					parse_all(white_space_or_comma);
					path.line_to(current_point);
				}
			}
			else if (command == 'C') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'c') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'S') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = parse_point();
					current_point = parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 's') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - cubic_p2;
					const Point p2 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.curve_to(p1, p2, current_point);
					cubic_p2 = p2;
				}
			}
			else if (command == 'Q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = parse_point();
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'q') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point + parse_point();
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'T') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 't') {
				while (copy().parse(number_start_char)) {
					const Point p1 = current_point * 2.f - quadratic_p1;
					current_point = current_point + parse_point();
					path.quadratic_curve_to(p1, current_point);
					quadratic_p1 = p1;
				}
			}
			else if (command == 'A') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'a') {
				while (copy().parse(number_start_char)) {
					const Point r = parse_point();
					const float rotation = parse_number();
					parse_all(white_space_or_comma);
					const bool large_arc = parse_number();
					parse_all(white_space_or_comma);
					const bool sweep = parse_number();
					parse_all(white_space_or_comma);
					current_point = current_point + parse_point();
					path.arc_to(r, rotation, large_arc, sweep, current_point);
				}
			}
			else if (command == 'Z' || command == 'z') {
				path.close();
				current_point = initial_point;
			}
			else {
				error("unexpected command");
			}
			if (command != 'C' && command != 'c' && command != 'S' && command != 's') {
				cubic_p2 = current_point;
			}
			if (command != 'Q' && command != 'q' && command != 'T' && command != 't') {
				quadratic_p1 = current_point;
			}
		}
	}